

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O1

int Int_ManProofTraceOne(Int_Man_t *p,Sto_Cls_t *pConflict,Sto_Cls_t *pFinal)

{
  ulong uVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  lit lVar5;
  uint *puVar6;
  Sto_Cls_t *pSVar7;
  lit *plVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  int *piVar19;
  bool bVar20;
  bool bVar21;
  timespec ts;
  uint local_64;
  timespec local_40;
  
  iVar10 = clock_gettime(3,&local_40);
  if (iVar10 < 0) {
    lVar17 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (p->fProofVerif != 0) {
    uVar15 = *(uint *)&pConflict->field_0x1c >> 3 & 0xffffff;
    if (p->nResLitsAlloc < (int)uVar15) {
      __assert_fail("(int)pConflict->nLits <= p->nResLitsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                    ,599,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
    }
    memcpy(p->pResLits,pConflict + 1,(ulong)(uVar15 << 2));
    p->nResLits = *(uint *)&pConflict->field_0x1c >> 3 & 0xffffff;
  }
  if ((*(uint *)&pConflict->field_0x1c & 0x7fffff8) != 0) {
    uVar11 = 0;
    do {
      p->pSeens[*(int *)((long)&pConflict[1].pNext + uVar11 * 4) >> 1] = '\x01';
      uVar11 = uVar11 + 1;
    } while (uVar11 < (*(uint *)&pConflict->field_0x1c >> 3 & 0xffffff));
  }
  if (p->pCnf->nClausesA != 0) {
    iVar10 = p->nWords;
    if (0 < (long)iVar10) {
      puVar6 = p->pInters;
      iVar3 = pFinal->Id;
      iVar4 = pConflict->Id;
      lVar12 = (long)iVar10 + 1;
      do {
        puVar6[(long)(iVar3 * iVar10) + lVar12 + -2] = puVar6[(long)(iVar4 * iVar10) + lVar12 + -2];
        lVar12 = lVar12 + -1;
      } while (1 < lVar12);
    }
  }
  if (0 < (long)p->nTrailSize) {
    local_64 = p->pProofNums[pConflict->Id];
    lVar12 = (long)p->nTrailSize;
    do {
      uVar15 = p->pTrail[lVar12 + -1] >> 1;
      if (p->pSeens[(int)uVar15] != '\0') {
        p->pSeens[(int)uVar15] = '\0';
        pSVar7 = p->pReasons[(int)uVar15];
        if (pSVar7 != (Sto_Cls_t *)0x0) {
          if (p->pTrail[lVar12 + -1] != *(int *)&pSVar7[1].pNext) {
            __assert_fail("p->pTrail[i] == pReason->pLits[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                          ,0x275,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
          }
          if ((*(uint *)&pSVar7->field_0x1c & 0x7fffff0) != 0) {
            lVar13 = 9;
            do {
              p->pSeens[*(int *)((long)&pSVar7->pNext + lVar13 * 4) >> 1] = '\x01';
              uVar11 = lVar13 - 7;
              lVar13 = lVar13 + 1;
            } while (uVar11 < (*(uint *)&pSVar7->field_0x1c >> 3 & 0xffffff));
          }
          iVar10 = pSVar7->Id;
          if (p->pProofNums[iVar10] < 1) {
            __assert_fail("Int_ManProofGet(p, pReason) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                          ,0x27d,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
          }
          uVar16 = p->Counter + 1;
          p->Counter = uVar16;
          if (p->fProofWrite != 0) {
            fprintf((FILE *)p->pFile,"%d * %d %d 0\n",(ulong)uVar16,(ulong)local_64,
                    (ulong)(uint)p->pProofNums[iVar10]);
          }
          local_64 = p->Counter;
          if (p->pCnf->nClausesA != 0) {
            iVar10 = pSVar7->Id;
            if (p->pVarTypes[(int)uVar15] == 1) {
              iVar3 = p->nWords;
              if (0 < (long)iVar3) {
                puVar6 = p->pInters;
                iVar4 = pFinal->Id;
                lVar13 = (long)iVar3 + 1;
                do {
                  puVar2 = puVar6 + (long)(iVar4 * iVar3) + lVar13 + -2;
                  *puVar2 = *puVar2 | puVar6[(long)(iVar10 * iVar3) + lVar13 + -2];
                  lVar13 = lVar13 + -1;
                } while (1 < lVar13);
              }
            }
            else {
              iVar3 = p->nWords;
              if (0 < (long)iVar3) {
                puVar6 = p->pInters;
                iVar4 = pFinal->Id;
                lVar13 = (long)iVar3 + 1;
                do {
                  puVar2 = puVar6 + (long)(iVar4 * iVar3) + lVar13 + -2;
                  *puVar2 = *puVar2 & puVar6[(long)(iVar10 * iVar3) + lVar13 + -2];
                  lVar13 = lVar13 + -1;
                } while (1 < lVar13);
              }
            }
          }
          if (p->fProofVerif != 0) {
            uVar16 = p->nResLits;
            if ((int)uVar16 < 1) {
              uVar11 = 0;
            }
            else {
              uVar11 = 0;
              do {
                if (p->pResLits[uVar11] >> 1 == uVar15) goto LAB_00542981;
                uVar11 = uVar11 + 1;
              } while (uVar16 != uVar11);
              uVar11 = (ulong)uVar16;
            }
LAB_00542981:
            if ((uint)uVar11 == uVar16) {
              printf("Recording clause %d: Cannot find variable %d in the temporary resolvent.\n",
                     (ulong)(uint)pFinal->Id,(ulong)uVar15);
            }
            uVar14 = uVar11 & 0xffffffff;
            if ((*(uint *)&pSVar7[1].pNext ^ p->pResLits[uVar14]) != 1) {
              printf("Recording clause %d: The resolved variable %d is in the wrong polarity.\n",
                     (ulong)(uint)pFinal->Id,(ulong)uVar15);
            }
            if (p->pResLits[uVar14] >> 1 != uVar15) {
              __assert_fail("lit_var(p->pResLits[v1]) == Var",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                            ,0x29a,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)"
                           );
            }
            iVar10 = p->nResLits + -1;
            p->nResLits = iVar10;
            if ((int)(uint)uVar11 < iVar10) {
              plVar8 = p->pResLits + uVar14;
              do {
                *plVar8 = plVar8[1];
                uVar15 = (int)uVar11 + 1;
                uVar11 = (ulong)uVar15;
                plVar8 = plVar8 + 1;
              } while ((int)uVar15 < p->nResLits);
            }
            if ((*(uint *)&pSVar7->field_0x1c & 0x7fffff0) != 0) {
              uVar11 = 1;
              do {
                uVar15 = p->nResLits;
                if ((int)uVar15 < 1) {
                  uVar14 = 0;
                }
                else {
                  uVar14 = 0;
                  do {
                    if ((p->pResLits[uVar14] ^ *(uint *)((long)&pSVar7[1].pNext + uVar11 * 4)) < 2)
                    goto LAB_00542a5a;
                    uVar14 = uVar14 + 1;
                  } while (uVar15 != uVar14);
                  uVar14 = (ulong)uVar15;
                }
LAB_00542a5a:
                if ((uint)uVar14 == uVar15) {
                  if (uVar15 == p->nResLitsAlloc) {
                    printf("Recording clause %d: Ran out of space for intermediate resolvent.\n",
                           (ulong)(uint)pFinal->Id);
                  }
                  lVar5 = *(lit *)((long)&pSVar7[1].pNext + uVar11 * 4);
                  iVar10 = p->nResLits;
                  p->nResLits = iVar10 + 1;
                  p->pResLits[iVar10] = lVar5;
                }
                else if (p->pResLits[uVar14 & 0xffffffff] !=
                         *(int *)((long)&pSVar7[1].pNext + uVar11 * 4)) {
                  printf("Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n"
                         ,(ulong)(uint)pFinal->Id);
                }
                uVar11 = uVar11 + 1;
              } while (uVar11 < (*(uint *)&pSVar7->field_0x1c >> 3 & 0xffffff));
            }
          }
        }
      }
      bVar21 = 1 < lVar12;
      lVar12 = lVar12 + -1;
    } while (bVar21);
  }
  if (p->fProofVerif != 0) {
    uVar11 = (ulong)p->nResLits;
    if (0 < (long)uVar11) {
      uVar15 = *(uint *)&pFinal->field_0x1c >> 3 & 0xffffff;
      uVar14 = 0;
      bVar21 = 0 < (long)uVar11;
      do {
        bVar9 = 0 < (long)uVar11;
        if (uVar15 == 0) {
LAB_00542b78:
          if (bVar9) {
            printf("Recording clause %d: The final resolvent is wrong.\n",(ulong)(uint)pFinal->Id);
            Int_ManPrintClause(p,pConflict);
            Int_ManPrintResolvent(p->pResLits,p->nResLits);
            Int_ManPrintClause(p,pFinal);
          }
          break;
        }
        bVar20 = uVar15 != 0;
        bVar9 = bVar21;
        if (*(int *)&pFinal[1].pNext != p->pResLits[uVar14]) {
          uVar18 = 0;
          do {
            if ((ulong)uVar15 - 1 == uVar18) goto LAB_00542b78;
            uVar1 = uVar18 + 1;
            lVar12 = uVar18 * 4;
            uVar18 = uVar1;
          } while (*(int *)((long)&pFinal[1].pNext + lVar12 + 4) != p->pResLits[uVar14]);
          bVar20 = uVar1 < uVar15;
        }
        if (!bVar20) goto LAB_00542b78;
        uVar14 = uVar14 + 1;
        bVar21 = uVar14 < uVar11;
      } while (uVar14 != uVar11);
    }
    piVar19 = &p->nResLits;
    if (*piVar19 != (*(uint *)&pFinal->field_0x1c >> 3 & 0xffffff)) {
      uVar15 = *(uint *)&pFinal->field_0x1c;
      uVar16 = uVar15 >> 3 & 0xffffff;
      if (uVar16 != 0) {
        iVar10 = 0;
        do {
          uVar11 = (ulong)*piVar19;
          bVar21 = 0 < (long)uVar11;
          if ((long)uVar11 < 1) {
LAB_00542c33:
            *(uint *)&pFinal->field_0x1c = uVar15 & 0xf8000007 | uVar15 + 0x7fffff8 & 0x7fffff8;
            if (iVar10 < (int)(uVar15 + 0x7fffff8 >> 3 & 0xffffff)) {
              lVar12 = (long)iVar10;
              do {
                *(undefined4 *)((long)&pFinal[1].pNext + lVar12 * 4) =
                     *(undefined4 *)((long)&pFinal[1].pNext + lVar12 * 4 + 4);
                lVar12 = lVar12 + 1;
              } while (lVar12 < (long)(ulong)(*(uint *)&pFinal->field_0x1c >> 3 & 0xffffff));
            }
            iVar10 = iVar10 + -1;
          }
          else {
            iVar3 = *(int *)((long)&pFinal[1].pNext + (long)iVar10 * 4);
            if (iVar3 != *p->pResLits) {
              uVar14 = 0;
              do {
                if (uVar11 - 1 == uVar14) goto LAB_00542c33;
                uVar18 = uVar14 + 1;
                lVar12 = uVar14 + 1;
                uVar14 = uVar18;
              } while (iVar3 != p->pResLits[lVar12]);
              bVar21 = uVar18 < uVar11;
            }
            if (!bVar21) goto LAB_00542c33;
          }
          iVar10 = iVar10 + 1;
          uVar15 = *(uint *)&pFinal->field_0x1c;
          uVar16 = uVar15 >> 3 & 0xffffff;
        } while (iVar10 < (int)uVar16);
      }
      if (*piVar19 != uVar16) {
        __assert_fail("p->nResLits == (int)pFinal->nLits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                      ,0x2e7,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
      }
    }
  }
  iVar10 = clock_gettime(3,&local_40);
  if (iVar10 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeTrace = p->timeTrace + lVar12 + lVar17;
  piVar19 = p->pProofNums;
  piVar19[pFinal->Id] = p->Counter;
  if (piVar19[(long)pFinal->Id + -1] == p->Counter) {
    __assert_fail("p->pProofNums[pFinal->Id-1] != p->Counter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInter.c"
                  ,0x2f3,"int Int_ManProofTraceOne(Int_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
  }
  return p->Counter;
}

Assistant:

int Int_ManProofTraceOne( Int_Man_t * p, Sto_Cls_t * pConflict, Sto_Cls_t * pFinal )
{
    Sto_Cls_t * pReason;
    int i, v, Var, PrevId;
    int fPrint = 0;
    abctime clk = Abc_Clock();

    // collect resolvent literals
    if ( p->fProofVerif )
    {
        assert( (int)pConflict->nLits <= p->nResLitsAlloc );
        memcpy( p->pResLits, pConflict->pLits, sizeof(lit) * pConflict->nLits );
        p->nResLits = pConflict->nLits;
    }

    // mark all the variables in the conflict as seen
    for ( v = 0; v < (int)pConflict->nLits; v++ )
        p->pSeens[lit_var(pConflict->pLits[v])] = 1;

    // start the anticedents
//    pFinal->pAntis = Vec_PtrAlloc( 32 );
//    Vec_PtrPush( pFinal->pAntis, pConflict );

    if ( p->pCnf->nClausesA )
        Int_ManTruthCopy( Int_ManTruthRead(p, pFinal), Int_ManTruthRead(p, pConflict), p->nWords );

    // follow the trail backwards
    PrevId = Int_ManProofGet(p, pConflict);
    for ( i = p->nTrailSize - 1; i >= 0; i-- )
    {
        // skip literals that are not involved
        Var = lit_var(p->pTrail[i]);
        if ( !p->pSeens[Var] )
            continue;
        p->pSeens[Var] = 0;

        // skip literals of the resulting clause
        pReason = p->pReasons[Var];
        if ( pReason == NULL )
            continue;
        assert( p->pTrail[i] == pReason->pLits[0] );

        // add the variables to seen
        for ( v = 1; v < (int)pReason->nLits; v++ )
            p->pSeens[lit_var(pReason->pLits[v])] = 1;


        // record the reason clause
        assert( Int_ManProofGet(p, pReason) > 0 );
        p->Counter++;
        if ( p->fProofWrite )
            fprintf( p->pFile, "%d * %d %d 0\n", p->Counter, PrevId, Int_ManProofGet(p, pReason) );
        PrevId = p->Counter;

        if ( p->pCnf->nClausesA )
        {
            if ( p->pVarTypes[Var] == 1 ) // var of A
                Int_ManTruthOr( Int_ManTruthRead(p, pFinal), Int_ManTruthRead(p, pReason), p->nWords );
            else
                Int_ManTruthAnd( Int_ManTruthRead(p, pFinal), Int_ManTruthRead(p, pReason), p->nWords );
        }
 
        // resolve the temporary resolvent with the reason clause
        if ( p->fProofVerif )
        {
            int v1, v2; 
            if ( fPrint )
                Int_ManPrintResolvent( p->pResLits, p->nResLits );
            // check that the var is present in the resolvent
            for ( v1 = 0; v1 < p->nResLits; v1++ )
                if ( lit_var(p->pResLits[v1]) == Var )
                    break;
            if ( v1 == p->nResLits )
                printf( "Recording clause %d: Cannot find variable %d in the temporary resolvent.\n", pFinal->Id, Var );
            if ( p->pResLits[v1] != lit_neg(pReason->pLits[0]) )
                printf( "Recording clause %d: The resolved variable %d is in the wrong polarity.\n", pFinal->Id, Var );
            // remove this variable from the resolvent
            assert( lit_var(p->pResLits[v1]) == Var );
            p->nResLits--;
            for ( ; v1 < p->nResLits; v1++ )
                p->pResLits[v1] = p->pResLits[v1+1];
            // add variables of the reason clause
            for ( v2 = 1; v2 < (int)pReason->nLits; v2++ )
            {
                for ( v1 = 0; v1 < p->nResLits; v1++ )
                    if ( lit_var(p->pResLits[v1]) == lit_var(pReason->pLits[v2]) )
                        break;
                // if it is a new variable, add it to the resolvent
                if ( v1 == p->nResLits ) 
                {
                    if ( p->nResLits == p->nResLitsAlloc )
                        printf( "Recording clause %d: Ran out of space for intermediate resolvent.\n", pFinal->Id );
                    p->pResLits[ p->nResLits++ ] = pReason->pLits[v2];
                    continue;
                }
                // if the variable is the same, the literal should be the same too
                if ( p->pResLits[v1] == pReason->pLits[v2] )
                    continue;
                // the literal is different
                printf( "Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n", pFinal->Id );
            }
        }

//        Vec_PtrPush( pFinal->pAntis, pReason );
    }

    // unmark all seen variables
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        p->pSeens[lit_var(p->pTrail[i])] = 0;
    // check that the literals are unmarked
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        assert( p->pSeens[lit_var(p->pTrail[i])] == 0 );

    // use the resulting clause to check the correctness of resolution
    if ( p->fProofVerif )
    {
        int v1, v2; 
        if ( fPrint )
            Int_ManPrintResolvent( p->pResLits, p->nResLits );
        for ( v1 = 0; v1 < p->nResLits; v1++ )
        {
            for ( v2 = 0; v2 < (int)pFinal->nLits; v2++ )
                if ( pFinal->pLits[v2] == p->pResLits[v1] )
                    break;
            if ( v2 < (int)pFinal->nLits )
                continue;
            break;
        }
        if ( v1 < p->nResLits )
        {
            printf( "Recording clause %d: The final resolvent is wrong.\n", pFinal->Id );
            Int_ManPrintClause( p, pConflict );
            Int_ManPrintResolvent( p->pResLits, p->nResLits );
            Int_ManPrintClause( p, pFinal );
        }

        // if there are literals in the clause that are not in the resolvent
        // it means that the derived resolvent is stronger than the clause
        // we can replace the clause with the resolvent by removing these literals
        if ( p->nResLits != (int)pFinal->nLits )
        {
            for ( v1 = 0; v1 < (int)pFinal->nLits; v1++ )
            {
                for ( v2 = 0; v2 < p->nResLits; v2++ )
                    if ( pFinal->pLits[v1] == p->pResLits[v2] )
                        break;
                if ( v2 < p->nResLits )
                    continue;
                // remove literal v1 from the final clause
                pFinal->nLits--;
                for ( v2 = v1; v2 < (int)pFinal->nLits; v2++ )
                    pFinal->pLits[v2] = pFinal->pLits[v2+1];
                v1--;
            }
            assert( p->nResLits == (int)pFinal->nLits );
        }
    }
p->timeTrace += Abc_Clock() - clk;

    // return the proof pointer 
    if ( p->pCnf->nClausesA )
    {
//        Int_ManPrintInterOne( p, pFinal );
    }
    Int_ManProofSet( p, pFinal, p->Counter );
    // make sure the same proof ID is not asssigned to two consecutive clauses
    assert( p->pProofNums[pFinal->Id-1] != p->Counter );
    return p->Counter;
}